

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool __thiscall
QApplicationPrivate::compressEvent
          (QApplicationPrivate *this,QEvent *event,QObject *receiver,QPostEventList *postedEvents)

{
  byte bVar1;
  bool bVar2;
  Type TVar3;
  Type TVar4;
  const_iterator o;
  QPostEvent *pQVar5;
  QSize *pQVar6;
  QPoint *pQVar7;
  QRegion *pQVar8;
  QPostEventList *in_RDX;
  QUpdateLaterEvent *in_RSI;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  QPostEvent *postedEvent;
  add_const_t<QPostEventList> *__range1;
  Type type;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPostEvent> *in_stack_ffffffffffffff80;
  bool local_21;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar3 = QEvent::type(&in_RSI->super_QEvent);
  if (((TVar3 - Move < 2) || (TVar3 - LayoutRequest < 3)) || (TVar3 == LanguageChange)) {
    local_10.i = (QPostEvent *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QPostEvent>::begin(in_stack_ffffffffffffff80);
    o = QList<QPostEvent>::end(in_stack_ffffffffffffff80);
    while (bVar2 = QList<QPostEvent>::const_iterator::operator!=(&local_10,o), bVar2) {
      pQVar5 = QList<QPostEvent>::const_iterator::operator*(&local_10);
      if (((*(QPostEventList **)pQVar5 == in_RDX) && (*(long *)(pQVar5 + 8) != 0)) &&
         (TVar4 = QEvent::type(*(QEvent **)(pQVar5 + 8)), TVar4 == TVar3)) {
        if (TVar3 == Move) {
          pQVar7 = QMoveEvent::pos((QMoveEvent *)in_RSI);
          *(QPoint *)(*(long *)(pQVar5 + 8) + 0x10) = *pQVar7;
        }
        else if (TVar3 == Resize) {
          pQVar6 = QResizeEvent::size((QResizeEvent *)in_RSI);
          *(QSize *)(*(long *)(pQVar5 + 8) + 0x10) = *pQVar6;
        }
        else if (1 < TVar3 - LayoutRequest) {
          if (TVar3 == UpdateLater) {
            pQVar8 = QUpdateLaterEvent::region(in_RSI);
            QRegion::operator+=((QRegion *)(*(long *)(pQVar5 + 8) + 0x10),(QRegion *)pQVar8);
          }
          else if (TVar3 != LanguageChange) goto LAB_002cae6f;
        }
        if (in_RSI != (QUpdateLaterEvent *)0x0) {
          (**(code **)(*(long *)in_RSI + 8))();
        }
        local_21 = true;
        goto LAB_002cae83;
      }
LAB_002cae6f:
      QList<QPostEvent>::const_iterator::operator++(&local_10);
    }
    local_21 = false;
  }
  else {
    bVar1 = QCoreApplicationPrivate::compressEvent(in_RDI,(QObject *)in_RSI,in_RDX);
    local_21 = (bool)(bVar1 & 1);
  }
LAB_002cae83:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QApplicationPrivate::compressEvent(QEvent *event, QObject *receiver, QPostEventList *postedEvents)
{
    // Only compress the following events:
    const QEvent::Type type = event->type();
    switch (type) {
    case QEvent::UpdateRequest:
    case QEvent::UpdateLater:
    case QEvent::LayoutRequest:
    case QEvent::Resize:
    case QEvent::Move:
    case QEvent::LanguageChange:
        break;
    default:
        return QGuiApplicationPrivate::compressEvent(event, receiver, postedEvents);
    }

    for (const auto &postedEvent : std::as_const(*postedEvents)) {

        // Continue, unless a valid event of the same type exists for the same receiver
        if (postedEvent.receiver != receiver
            || !postedEvent.event
            || postedEvent.event->type() != type) {
            continue;
        }

        // Handle type specific compression
        switch (type) {
        case QEvent::Resize:
            static_cast<QResizeEvent *>(postedEvent.event)->m_size =
                static_cast<const QResizeEvent *>(event)->size();
            break;
        case QEvent::Move:
            static_cast<QMoveEvent *>(postedEvent.event)->m_pos =
                static_cast<const QMoveEvent *>(event)->pos();
            break;
        case QEvent::UpdateLater:
            static_cast<QUpdateLaterEvent *>(postedEvent.event)->m_region +=
                static_cast<const QUpdateLaterEvent *>(event)->region();
            break;
        case QEvent::UpdateRequest:
        case QEvent::LanguageChange:
        case QEvent::LayoutRequest:
            break;
        default:
            continue;
        }
        delete event;
        return true;
    }
    return false;
}